

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void pre_decrement_suite::test_array(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>> *pbVar2;
  reference pbVar3;
  pointer ptVar4;
  const_reference pbVar5;
  pointer ptVar6;
  size_type in_RCX;
  char *pcVar7;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_8c0;
  basic_variable<std::allocator<char>_> *local_800;
  basic_variable<std::allocator<char>_> local_7f8;
  const_iterator local_7c0;
  basic_variable<std::allocator<char>_> local_7a8;
  const_iterator local_770;
  basic_variable<std::allocator<char>_> local_758;
  const_iterator local_720;
  basic_variable<std::allocator<char>_> local_708;
  const_iterator local_6d0;
  basic_variable<std::allocator<char>_> local_6b8;
  const_iterator local_680;
  basic_variable<std::allocator<char>_> local_668;
  const_iterator local_630;
  basic_variable<std::allocator<char>_> local_618;
  const_iterator local_5e8;
  const_iterator local_5d0;
  undefined1 local_5b8 [8];
  const_iterator where_1;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  basic_variable<std::allocator<char>_> local_538;
  basic_variable<std::allocator<char>_> local_508;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  basic_variable<std::allocator<char>_> local_478;
  undefined1 local_448 [24];
  variable data_1;
  iterator local_3d0;
  basic_variable<std::allocator<char>_> local_3b8;
  iterator local_380;
  basic_variable<std::allocator<char>_> local_368;
  iterator local_330;
  basic_variable<std::allocator<char>_> local_318;
  iterator local_2e0;
  basic_variable<std::allocator<char>_> local_2c8;
  iterator local_290;
  basic_variable<std::allocator<char>_> local_278;
  iterator local_240;
  basic_variable<std::allocator<char>_> local_228;
  iterator local_1f8;
  iterator local_1e0;
  undefined1 local_1c8 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_800 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_800 = local_800 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_800);
  } while (local_800 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_1c8,&local_1e0);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x527,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1f8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_1f8);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x529,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u32string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u32string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x52a,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_228,L"delta");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_228);
  boost::detail::test_impl
            ("*where == variable(U\"delta\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x52b,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_240,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_240);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x52d,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u16string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u16string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x52e,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"charlie");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_278);
  boost::detail::test_impl
            ("*where == variable(u\"charlie\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x52f,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_290,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_290);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x531,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_290);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::wstring_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x532,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2c8,L"bravo");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_2c8);
  boost::detail::test_impl
            ("*where == variable(L\"bravo\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x533,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2e0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_2e0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x535,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e0);
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x536,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"alpha");
  bVar1 = trial::dynamic::operator==(pbVar3,&local_318);
  boost::detail::test_impl
            ("*where == variable(\"alpha\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x537,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_330,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_330);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x539,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>(ptVar4);
  boost::detail::test_impl
            ("where->same<double>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x53a,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_368,3.0);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_368);
  boost::detail::test_impl
            ("*where == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x53b,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_380,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_380);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x53d,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_380);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>(ptVar4);
  boost::detail::test_impl
            ("where->same<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x53e,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3b8,2);
  bVar1 = trial::dynamic::operator==(pbVar3,&local_3b8);
  boost::detail::test_impl
            ("*where == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x53f,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    ((iterator *)local_1c8,&local_3d0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x541,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d0);
  ptVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_1c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<bool>(ptVar4);
  boost::detail::test_impl
            ("where->same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x542,"void pre_decrement_suite::test_array()",bVar1);
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                     ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28,true);
  bVar1 = trial::dynamic::operator==
                    (pbVar3,(basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  pcVar7 = "void pre_decrement_suite::test_array()";
  boost::detail::test_impl
            ("*where == variable(true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x543,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,true);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,2);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_538;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,3.0);
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_508;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,"alpha");
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_4d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"bravo");
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_4a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"charlie");
  where_1.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = &local_478;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)
             where_1.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_,L"delta");
  local_448._0_8_ = &local_598;
  local_448._8_8_ = 7;
  init_00._M_len = (size_type)pcVar7;
  init_00._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_448 + 0x10),
             (basic_array<std::allocator<char>_> *)local_448._0_8_,init_00);
  local_8c0 = (basic_variable<std::allocator<char>_> *)local_448;
  do {
    local_8c0 = local_8c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8c0);
  } while (local_8c0 != &local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)local_5b8,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10)
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d0,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator==
                    ((const_iterator *)local_5b8,&local_5d0);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x548,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_5d0)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5e8,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_5e8);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x54a,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_5e8)
  ;
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u32string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u32string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x54b,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_618,L"delta");
  bVar1 = trial::dynamic::operator==(pbVar5,&local_618);
  boost::detail::test_impl
            ("*where == variable(U\"delta\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x54c,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_630,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_630);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x54e,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_630)
  ;
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::u16string>
                    (pbVar2);
  boost::detail::test_impl
            ("where->same<variable::u16string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x54f,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_668,L"charlie");
  bVar1 = trial::dynamic::operator==(pbVar5,&local_668);
  boost::detail::test_impl
            ("*where == variable(u\"charlie\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x550,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_680,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_680);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x552,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_680)
  ;
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::wstring>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::wstring_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x553,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6b8,L"bravo");
  bVar1 = trial::dynamic::operator==(pbVar5,&local_6b8);
  boost::detail::test_impl
            ("*where == variable(L\"bravo\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x554,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6d0,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_6d0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x556,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_6d0)
  ;
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::same<std::__cxx11::string>(pbVar2);
  boost::detail::test_impl
            ("where->same<variable::string_type>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x557,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_708,"alpha");
  bVar1 = trial::dynamic::operator==(pbVar5,&local_708);
  boost::detail::test_impl
            ("*where == variable(\"alpha\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x558,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_720,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_720);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x55a,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_720)
  ;
  ptVar6 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>(ptVar6);
  boost::detail::test_impl
            ("where->same<double>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x55b,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_758,3.0);
  bVar1 = trial::dynamic::operator==(pbVar5,&local_758);
  boost::detail::test_impl
            ("*where == variable(3.0)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x55c,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_770,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_770);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x55e,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_770)
  ;
  ptVar6 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>(ptVar6);
  boost::detail::test_impl
            ("where->same<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x55f,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_7a8,2);
  bVar1 = trial::dynamic::operator==(pbVar5,&local_7a8);
  boost::detail::test_impl
            ("*where == variable(2)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x560,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::operator--((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7c0,(basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    ((const_iterator *)local_5b8,&local_7c0);
  boost::detail::test_impl
            ("where != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x562,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_7c0)
  ;
  ptVar6 = trial::dynamic::basic_variable<std::allocator<char>_>::
           iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
           ::operator->((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_5b8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<bool>(ptVar6);
  boost::detail::test_impl
            ("where->same<bool>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x563,"void pre_decrement_suite::test_array()",bVar1);
  pbVar5 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_7f8,true);
  bVar1 = trial::dynamic::operator==(pbVar5,&local_7f8);
  boost::detail::test_impl
            ("*where == variable(true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x564,"void pre_decrement_suite::test_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_448 + 0x10));
  return;
}

Assistant:

void test_array()
{
    {
        variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        variable::iterator where = data.end();
        TRIAL_PROTOCOL_TEST(where == data.end());
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::u32string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(U"delta"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::u16string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(u"charlie"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::wstring_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(L"bravo"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable("alpha"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<double>());
        TRIAL_PROTOCOL_TEST(*where == variable(3.0));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<int>());
        TRIAL_PROTOCOL_TEST(*where == variable(2));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<bool>());
        TRIAL_PROTOCOL_TEST(*where == variable(true));
    }
    {
        const variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        variable::const_iterator where = data.end();
        TRIAL_PROTOCOL_TEST(where == data.end());
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::u32string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(U"delta"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::u16string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(u"charlie"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::wstring_type>());
        TRIAL_PROTOCOL_TEST(*where == variable(L"bravo"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<variable::string_type>());
        TRIAL_PROTOCOL_TEST(*where == variable("alpha"));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<double>());
        TRIAL_PROTOCOL_TEST(*where == variable(3.0));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<int>());
        TRIAL_PROTOCOL_TEST(*where == variable(2));
        --where;
        TRIAL_PROTOCOL_TEST(where != data.end());
        TRIAL_PROTOCOL_TEST(where->same<bool>());
        TRIAL_PROTOCOL_TEST(*where == variable(true));
    }
}